

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O2

void __thiscall chrono::ChConstraintNgeneric::Increment_q(ChConstraintNgeneric *this,double deltal)

{
  pointer ppCVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  double local_78;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> local_70 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_58;
  
  lVar3 = 0;
  local_78 = deltal;
  for (uVar2 = 0;
      ppCVar1 = (this->variables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->variables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (ppCVar1[uVar2]->disabled == false) {
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
                (&local_58,
                 (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 ((long)&(((this->Eq).
                           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data + lVar3),&local_78);
      ChVariables::Get_qb((ChVectorRef *)local_70,
                          (this->variables).
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar2]);
      Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
      operator+=(local_70,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                           *)&local_58);
    }
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void ChConstraintNgeneric::Increment_q(const double deltal) {
    for (size_t i = 0; i < variables.size(); ++i) {
        if (variables[i]->IsActive()) {
            variables[i]->Get_qb() += Eq[i] * deltal;
        }
    }
}